

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecRe.c
# Opt level: O3

void Ree_CollectInsiders_rec(Gia_Man_t *pGia,int iObj,Vec_Bit_t *vVisited,Vec_Bit_t *vInsiders)

{
  int Entry;
  
  if (-1 < iObj) {
    if (iObj < vVisited->nSize) {
      if (((uint)vVisited->pArray[(uint)iObj >> 5] >> (iObj & 0x1fU) & 1) != 0) {
        return;
      }
      Vec_BitSetEntry(vVisited,iObj,(int)vVisited);
      if (iObj < pGia->nObjs) {
        Ree_CollectInsiders_rec
                  (pGia,iObj - (*(uint *)(pGia->pObjs + (uint)iObj) & 0x1fffffff),vVisited,vInsiders
                  );
        if (iObj < pGia->nObjs) {
          Ree_CollectInsiders_rec
                    (pGia,iObj - (*(uint *)&pGia->pObjs[(uint)iObj].field_0x4 & 0x1fffffff),vVisited
                     ,vInsiders);
          Vec_BitSetEntry(vInsiders,iObj,Entry);
          return;
        }
      }
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
}

Assistant:

void Ree_CollectInsiders_rec( Gia_Man_t * pGia, int iObj, Vec_Bit_t * vVisited, Vec_Bit_t * vInsiders )
{
    if ( Vec_BitEntry(vVisited, iObj) )
        return;
    Vec_BitSetEntry( vVisited, iObj, 1 );
    Ree_CollectInsiders_rec( pGia, Gia_ObjFaninId0p(pGia, Gia_ManObj(pGia, iObj)), vVisited, vInsiders );
    Ree_CollectInsiders_rec( pGia, Gia_ObjFaninId1p(pGia, Gia_ManObj(pGia, iObj)), vVisited, vInsiders );
    Vec_BitSetEntry( vInsiders, iObj, 1 );
}